

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlGetMinOccurs(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int min,int max,int def,
                   char *expected)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  xmlNodePtr node_00;
  byte *expected_00;
  int iVar4;
  undefined4 in_register_0000000c;
  byte *pbVar5;
  xmlChar *unaff_RBX;
  ulong uVar6;
  xmlChar *unaff_R12;
  
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode(node,"minOccurs");
  if ((node_00 != (xmlNodePtr)0x0) &&
     (expected_00 = xmlSchemaGetNodeContent(ctxt,node_00), pbVar2 = expected_00,
     expected_00 != (byte *)0x0)) {
    do {
      pbVar5 = pbVar2 + 1;
      uVar6 = (ulong)*pbVar2;
      if (0x20 < uVar6) goto LAB_00192c3c;
      pbVar2 = pbVar5;
    } while ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0);
    if (uVar6 != 0) {
LAB_00192c3c:
      iVar4 = 0;
      while ((byte)((char)uVar6 - 0x30U) < 10) {
        iVar3 = 0x7fffffff;
        if ((iVar4 < 0xccccccd) &&
           (iVar3 = iVar4 * 10 + -0x30 + (int)uVar6, -0x7fffffd1 - (int)uVar6 < iVar4 * 10)) {
          iVar3 = 0x7fffffff;
        }
        iVar4 = iVar3;
        bVar1 = *pbVar5;
        pbVar5 = pbVar5 + 1;
        uVar6 = (ulong)bVar1;
      }
      while ((byte)uVar6 < 0x21) {
        if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
          if ((uVar6 == 0) && (-1 < iVar4)) {
            if (min == -1) {
              return iVar4;
            }
            if (iVar4 <= min) {
              return iVar4;
            }
          }
          break;
        }
        bVar1 = *pbVar5;
        pbVar5 = pbVar5 + 1;
        uVar6 = (ulong)bVar1;
      }
    }
    xmlSchemaPSimpleTypeErr
              (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)node_00,
               (xmlNodePtr)0x0,(xmlSchemaTypePtr)CONCAT44(in_register_0000000c,max),
               (char *)expected_00,(xmlChar *)0x0,(char *)0x0,unaff_RBX,unaff_R12);
  }
  return 1;
}

Assistant:

static int
xmlGetMinOccurs(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node,
		int min, int max, int def, const char *expected)
{
    const xmlChar *val, *cur;
    int ret = 0;
    xmlAttrPtr attr;

    attr = xmlSchemaGetPropNode(node, "minOccurs");
    if (attr == NULL)
	return (def);
    val = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (val == NULL)
	return (def);
    cur = val;
    while (IS_BLANK_CH(*cur))
        cur++;
    if (*cur == 0) {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    while ((*cur >= '0') && (*cur <= '9')) {
        if (ret > INT_MAX / 10) {
            ret = INT_MAX;
        } else {
            int digit = *cur - '0';
            ret *= 10;
            if (ret > INT_MAX - digit)
                ret = INT_MAX;
            else
                ret += digit;
        }
        cur++;
    }
    while (IS_BLANK_CH(*cur))
        cur++;
    /*
    * TODO: Restrict the maximal value to Integer.
    */
    if ((*cur != 0) || (ret < min) || ((max != -1) && (ret > max))) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    return (ret);
}